

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O2

void __thiscall CGL::RaytracedRenderer::stop(RaytracedRenderer *this)

{
  State SVar1;
  thread *this_00;
  size_type sVar2;
  int i;
  ulong uVar3;
  
  SVar1 = this->state;
  if (SVar1 != DONE) {
    if (SVar1 != RENDERING) {
      if (SVar1 != VISUALIZE) {
        return;
      }
      while (sVar2 = std::
                     deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
                     ::size(&(this->selectionHistory).c), 1 < sVar2) {
        std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
        pop_back(&(this->selectionHistory).c);
      }
      goto LAB_0012032b;
    }
    this->continueRaytracing = false;
  }
  for (uVar3 = 0; uVar3 < this->numWorkerThreads; uVar3 = uVar3 + 1) {
    std::thread::join();
    this_00 = (this->workerThreads).
              super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
    if (this_00 != (thread *)0x0) {
      std::thread::~thread(this_00);
    }
    operator_delete(this_00);
  }
LAB_0012032b:
  this->state = READY;
  return;
}

Assistant:

void RaytracedRenderer::stop() {
  switch (state) {
    case INIT:
    case READY:
      break;
    case VISUALIZE:
      while (selectionHistory.size() > 1) {
        selectionHistory.pop();
      }
      state = READY;
      break;
    case RENDERING:
      continueRaytracing = false;
    case DONE:
      for (int i=0; i<numWorkerThreads; i++) {
            workerThreads[i]->join();
            delete workerThreads[i];
        }
      state = READY;
      break;
  }
}